

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O2

void SimpleString::padStringsToSameLength(SimpleString *str1,SimpleString *str2,char padCharacter)

{
  size_t sVar1;
  size_t sVar2;
  SimpleString *this;
  char local_42 [2];
  SimpleString local_40;
  SimpleString local_30;
  
  do {
    this = str1;
    str1 = str2;
    sVar1 = size(this);
    sVar2 = size(str1);
    str2 = this;
  } while (sVar2 < sVar1);
  local_42[1] = 0;
  local_42[0] = padCharacter;
  SimpleString(&local_30,local_42,sVar2 - sVar1);
  operator+(&local_40,&local_30);
  operator=(this,&local_40);
  ~SimpleString(&local_40);
  ~SimpleString(&local_30);
  return;
}

Assistant:

void SimpleString::padStringsToSameLength(SimpleString& str1, SimpleString& str2, char padCharacter)
{
    if (str1.size() > str2.size()) {
        padStringsToSameLength(str2, str1, padCharacter);
        return;
    }

    char pad[2];
    pad[0] = padCharacter;
    pad[1] = 0;
    str1 = SimpleString(pad, str2.size() - str1.size()) + str1;
}